

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  int iVar1;
  int __how;
  char *pcVar2;
  _Any_data *this;
  double *args;
  char *args_00;
  char (*in_R9) [10];
  long lVar3;
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  init;
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  init_00;
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  init_01;
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  init_02;
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  init_03;
  initializer_list_t init_04;
  format_string<int> fmt;
  format_string<int> fmt_00;
  format_string<double> fmt_01;
  format_string<const_char_(&)[4],_const_char_(&)[10]> fmt_02;
  format_string<const_char_(&)[6],_const_char_(&)[5]> fmt_03;
  format_string<int_&> fmt_04;
  _Head_base<0UL,_spdlog::populators::date_time_populator_*,_false> local_1460;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1458;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1448;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1428;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1408;
  undefined1 local_13e8 [8];
  undefined8 local_13e0;
  undefined1 *local_13d8;
  undefined1 local_13d0;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_13c8;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_13a8;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1388;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1368;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1348;
  undefined1 local_1328 [8];
  undefined8 local_1320;
  undefined1 *local_1318;
  undefined1 local_1310;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1308;
  undefined1 local_12e8 [8];
  undefined8 local_12e0;
  undefined1 *local_12d8;
  undefined1 local_12d0;
  _Any_data local_12c8;
  code *local_12b8;
  code *local_12b0;
  executor local_1110;
  executor local_f60;
  executor local_db0;
  executor local_c00;
  executor local_a50;
  executor local_8a0;
  executor local_6f0;
  executor local_540;
  executor local_390;
  executor local_1e0;
  
  spdlog::cfg::load_env_levels();
  spdlog::info<char[19]>((executor *)&local_12c8,(char (*) [19])"Welcome to spdlog!");
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref<const_char_(&)[8],_0>(&local_1448,(char (*) [8])"version");
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref<const_char_(&)[6],_0>(&local_1408,(char (*) [6])"major");
  local_13d8 = local_13e8;
  local_13e8[0] = 5;
  local_13e0 = 1;
  local_13d0 = 1;
  init._M_len = 2;
  init._M_array = &local_1408;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref(&local_13a8,init);
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref<const_char_(&)[6],_0>(&local_1308,(char (*) [6])"minor");
  local_12d8 = local_12e8;
  local_12e8[0] = 5;
  local_12e0 = 9;
  local_12d0 = 1;
  init_00._M_len = 2;
  init_00._M_array = &local_1308;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref(&local_1388,init_00);
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref<const_char_(&)[6],_0>(&local_1348,(char (*) [6])"patch");
  local_1318 = local_1328;
  local_1328[0] = 5;
  local_1320 = 2;
  local_1310 = 1;
  init_01._M_len = 2;
  init_01._M_array = &local_1348;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref(&local_1368,init_01);
  init_02._M_len = 3;
  init_02._M_array = &local_13a8;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref(&local_1428,init_02);
  init_03._M_len = 2;
  init_03._M_array = &local_1448;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref(&local_13c8,init_03);
  args = (double *)0x2;
  init_04._M_len = 1;
  init_04._M_array = &local_13c8;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_1458,init_04,true,array);
  spdlog::details::executor::operator()((executor *)&local_12c8,&local_1458);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_1458);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_13c8.owned_value);
  lVar3 = 0x20;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(&local_1448.owned_value.m_type + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  lVar3 = 0x40;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(&local_13a8.owned_value.m_type + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  lVar3 = 0x20;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(&local_1348.owned_value.m_type + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  lVar3 = 0x20;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(&local_1308.owned_value.m_type + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  lVar3 = 0x20;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(&local_1408.owned_value.m_type + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  spdlog::details::executor::~executor((executor *)&local_12c8);
  local_12c8._0_4_ = 0xc;
  fmt.str_.size_ = (size_t)&local_12c8;
  fmt.str_.data_ = (char *)0x23;
  spdlog::warn<int>(&local_1e0,(spdlog *)"Easy padding in numbers like {:08d}",fmt,(int *)args);
  spdlog::details::executor::~executor(&local_1e0);
  local_12c8._0_4_ = 0x2a;
  fmt_00.str_.size_ = (size_t)&local_12c8;
  fmt_00.str_.data_ = (char *)0x3c;
  spdlog::critical<int>
            (&local_390,(spdlog *)"Support for int: {0:d};  hex: {0:x};  oct: {0:o}; bin: {0:b}",
             fmt_00,(int *)args);
  spdlog::details::executor::~executor(&local_390);
  local_12c8._M_unused._M_object = &DAT_3ff3c0c1fc8f3238;
  fmt_01.str_.size_ = (size_t)&local_12c8;
  fmt_01.str_.data_ = (char *)0x1b;
  spdlog::info<double>(&local_540,(spdlog *)"Support for floats {:03.2f}",fmt_01,args);
  spdlog::details::executor::~executor(&local_540);
  fmt_02.str_.size_ = (size_t)"too";
  fmt_02.str_.data_ = (char *)0x1d;
  spdlog::info<char_const(&)[4],char_const(&)[10]>
            (&local_6f0,(spdlog *)"Positional args are {1} {0}..",fmt_02,(char (*) [4])"supported",
             in_R9);
  spdlog::details::executor::~executor(&local_6f0);
  args_00 = "left";
  fmt_03.str_.size_ = (size_t)"right";
  fmt_03.str_.data_ = (char *)0x1c;
  spdlog::info<char_const(&)[6],char_const(&)[5]>
            (&local_8a0,(spdlog *)"{:>8} aligned, {:<8} aligned",fmt_03,(char (*) [6])"left",
             (char (*) [5])in_R9);
  spdlog::details::executor::~executor(&local_8a0);
  spdlog::set_level(info);
  spdlog::debug<char[38]>(&local_a50,(char (*) [38])"This message should not be displayed!");
  spdlog::details::executor::~executor(&local_a50);
  spdlog::set_level(trace);
  spdlog::debug<char[35]>(&local_c00,(char (*) [35])"This message should be displayed..");
  spdlog::details::executor::~executor(&local_c00);
  spdlog::details::make_unique<spdlog::populators::date_time_populator>();
  spdlog::details::make_unique<spdlog::populators::level_populator>();
  spdlog::details::make_unique<spdlog::populators::thread_id_populator>();
  spdlog::details::make_unique<spdlog::populators::message_populator>();
  spdlog::
  set_populators<std::unique_ptr<spdlog::populators::date_time_populator,std::default_delete<spdlog::populators::date_time_populator>>,std::unique_ptr<spdlog::populators::level_populator,std::default_delete<spdlog::populators::level_populator>>,std::unique_ptr<spdlog::populators::thread_id_populator,std::default_delete<spdlog::populators::thread_id_populator>>,std::unique_ptr<spdlog::populators::message_populator,std::default_delete<spdlog::populators::message_populator>>>
            ((unique_ptr<spdlog::populators::date_time_populator,_std::default_delete<spdlog::populators::date_time_populator>_>
              *)&local_12c8,
             (unique_ptr<spdlog::populators::level_populator,_std::default_delete<spdlog::populators::level_populator>_>
              *)&local_13a8,
             (unique_ptr<spdlog::populators::thread_id_populator,_std::default_delete<spdlog::populators::thread_id_populator>_>
              *)&local_1448,
             (unique_ptr<spdlog::populators::message_populator,_std::default_delete<spdlog::populators::message_populator>_>
              *)&local_1408);
  if ((long *)local_1408.owned_value._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_1408.owned_value._0_8_ + 8))();
  }
  if ((long *)local_1448.owned_value._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_1448.owned_value._0_8_ + 8))();
  }
  if ((long *)local_13a8.owned_value._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_13a8.owned_value._0_8_ + 8))();
  }
  if ((long *)local_12c8._M_unused._0_8_ != (long *)0x0) {
    (**(code **)(*local_12c8._M_unused._M_object + 8))();
  }
  spdlog::info<char[47]>(&local_db0,(char (*) [47])"This is an info message with custom populators")
  ;
  spdlog::details::executor::~executor(&local_db0);
  spdlog::set_populators<>();
  pcVar2 = "This should log an empty json object";
  spdlog::info<char[37]>(&local_f60,(char (*) [37])"This should log an empty json object");
  spdlog::details::executor::~executor(&local_f60);
  spdlog::details::make_unique<spdlog::json_formatter>();
  local_1460._M_head_impl = (date_time_populator *)local_12c8._M_unused._0_8_;
  local_12c8._M_unused._M_object = (long *)0x0;
  spdlog::set_formatter
            ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)&local_1460);
  if (local_1460._M_head_impl != (date_time_populator *)0x0) {
    (*((local_1460._M_head_impl)->super_pattern_populator).super_populator._vptr_populator[1])();
  }
  local_1460._M_head_impl = (date_time_populator *)0x0;
  if ((long *)local_12c8._M_unused._0_8_ != (long *)0x0) {
    (**(code **)(*local_12c8._M_unused._M_object + 8))();
  }
  spdlog::set_level(info);
  spdlog::enable_backtrace(10);
  iVar1 = 0;
  while( true ) {
    __how = (int)pcVar2;
    local_12c8._0_4_ = iVar1;
    if (99 < iVar1) break;
    pcVar2 = "Backtrace message {}";
    fmt_04.str_.size_ = (size_t)&local_12c8;
    fmt_04.str_.data_ = (char *)0x14;
    spdlog::debug<int&>(&local_1110,(spdlog *)"Backtrace message {}",fmt_04,(int *)args_00);
    spdlog::details::executor::~executor(&local_1110);
    iVar1 = local_12c8._0_4_ + 1;
  }
  spdlog::dump_backtrace();
  stdout_logger_example();
  basic_example();
  rotating_example();
  daily_example();
  async_example();
  binary_example();
  multi_sink_example();
  user_defined_example();
  err_handler_example();
  trace_example();
  stopwatch_example();
  udp_example();
  custom_flags_example();
  spdlog::flush_every((seconds)0x3);
  local_12c8._M_unused._M_object = (void *)0x0;
  local_12c8._8_8_ = 0;
  local_12b0 = std::
               _Function_handler<void_(std::shared_ptr<spdlog::logger>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/takeshibaconsuzuki[P]structlog/example/example.cpp:105:27)>
               ::_M_invoke;
  local_12b8 = std::
               _Function_handler<void_(std::shared_ptr<spdlog::logger>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/takeshibaconsuzuki[P]structlog/example/example.cpp:105:27)>
               ::_M_manager;
  spdlog::apply_all((function<void_(std::shared_ptr<spdlog::logger>)> *)&local_12c8);
  this = &local_12c8;
  std::_Function_base::~_Function_base((_Function_base *)this);
  spdlog::shutdown((int)this,__how);
  return 0;
}

Assistant:

int main(int, char *[])
{
    // Log levels can be loaded from argv/env using "SPDLOG_LEVEL"
    load_levels_example();

#ifdef SPDLOG_JSON_LOGGER
    spdlog::info("Welcome to spdlog!")(
        {{"version", {{"major", SPDLOG_VER_MAJOR}, {"minor", SPDLOG_VER_MINOR}, {"patch", SPDLOG_VER_PATCH}}}});
#else
    spdlog::info("Welcome to spdlog version {}.{}.{}  !", SPDLOG_VER_MAJOR, SPDLOG_VER_MINOR, SPDLOG_VER_PATCH);
#endif

    spdlog::warn("Easy padding in numbers like {:08d}", 12);
    spdlog::critical("Support for int: {0:d};  hex: {0:x};  oct: {0:o}; bin: {0:b}", 42);
    spdlog::info("Support for floats {:03.2f}", 1.23456);
    spdlog::info("Positional args are {1} {0}..", "too", "supported");
    spdlog::info("{:>8} aligned, {:<8} aligned", "right", "left");

    // Runtime log levels
    spdlog::set_level(spdlog::level::info); // Set global log level to info
    spdlog::debug("This message should not be displayed!");
    spdlog::set_level(spdlog::level::trace); // Set specific logger's log level
    spdlog::debug("This message should be displayed..");

    // Customize msg format for all loggers
#ifdef SPDLOG_JSON_LOGGER
    spdlog::set_populators(
        spdlog::details::make_unique<spdlog::populators::date_time_populator>(),
        spdlog::details::make_unique<spdlog::populators::level_populator>(),
        spdlog::details::make_unique<spdlog::populators::thread_id_populator>(),
        spdlog::details::make_unique<spdlog::populators::message_populator>());
    spdlog::info("This is an info message with custom populators");
    spdlog::set_populators();
    spdlog::info("This should log an empty json object");
#else
    spdlog::set_pattern("[%H:%M:%S %z] [%^%L%$] [thread %t] %v");
    spdlog::info("This an info message with custom format");
#endif
    spdlog::set_formatter(spdlog::details::make_unique<spdlog::default_formatter>()); // back to default format
    spdlog::set_level(spdlog::level::info);

    // Backtrace support
    // Loggers can store in a ring buffer all messages (including debug/trace) for later inspection.
    // When needed, call dump_backtrace() to see what happened:
    spdlog::enable_backtrace(10); // create ring buffer with capacity of 10  messages
    for (int i = 0; i < 100; i++)
    {
        spdlog::debug("Backtrace message {}", i); // not logged..
    }
    // e.g. if some error happened:
    spdlog::dump_backtrace(); // log them now!

    try
    {
        stdout_logger_example();
        basic_example();
        rotating_example();
        daily_example();
        async_example();
        binary_example();
        multi_sink_example();
        user_defined_example();
        err_handler_example();
        trace_example();
        stopwatch_example();
        udp_example();
        custom_flags_example();

        // Flush all *registered* loggers using a worker thread every 3 seconds.
        // note: registered loggers *must* be thread safe for this to work correctly!
        spdlog::flush_every(std::chrono::seconds(3));

        // Apply some function on all registered loggers
        spdlog::apply_all([&](std::shared_ptr<spdlog::logger> l) { l->info("End of example."); });

        // Release all spdlog resources, and drop all loggers in the registry.
        // This is optional (only mandatory if using windows + async log).
        spdlog::shutdown();
    }

    // Exceptions will only be thrown upon failed logger or sink construction (not during logging).
    catch (const spdlog::spdlog_ex &ex)
    {
        std::printf("Log initialization failed: %s\n", ex.what());
        return 1;
    }
}